

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O0

TRef recff_sbufx_check(jit_State *J,RecordFFData *rd,int arg)

{
  TRef TVar1;
  TRef TVar2;
  TRef TVar3;
  TRef ud;
  TRef trtype;
  int arg_local;
  RecordFFData *rd_local;
  jit_State *J_local;
  
  TVar1 = J->base[arg];
  if (((int)rd->argv[arg].field_4.it >> 0xf == -0xd) &&
     (*(char *)((rd->argv[arg].u64 & 0x7fffffffffff) + 10) == '\x03')) {
    (J->fold).ins.field_0.ot = 0x4510;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
    (J->fold).ins.field_0.op2 = 0xe;
    TVar2 = lj_opt_fold(J);
    TVar3 = lj_ir_kint(J,3);
    (J->fold).ins.field_0.ot = 0x893;
    (J->fold).ins.field_0.op1 = (IRRef1)TVar2;
    (J->fold).ins.field_0.op2 = (IRRef1)TVar3;
    lj_opt_fold(J);
    J->needsnap = '\x01';
    return TVar1;
  }
  lj_trace_err(J,LJ_TRERR_BADTYPE);
}

Assistant:

static TRef recff_sbufx_check(jit_State *J, RecordFFData *rd, int arg)
{
  TRef trtype, ud = J->base[arg];
  if (!tvisbuf(&rd->argv[arg])) lj_trace_err(J, LJ_TRERR_BADTYPE);
  trtype = emitir(IRT(IR_FLOAD, IRT_U8), ud, IRFL_UDATA_UDTYPE);
  emitir(IRTGI(IR_EQ), trtype, lj_ir_kint(J, UDTYPE_BUFFER));
  J->needsnap = 1;
  return ud;
}